

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O1

void Error::reportErrorAtToken
               (ostream *out,string *phase,shared_ptr<const_Readable> *reader,
               shared_ptr<Token> *token,string *message)

{
  element_type *peVar1;
  element_type *peVar2;
  ostream *poVar3;
  long *plVar4;
  ulong uVar5;
  char *local_80;
  string line;
  size_type *local_50;
  string arrow;
  
  peVar1 = (token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->tokenType == EndOfFile) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,"At end of file an error was discovered during ",0x2e);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(phase->_M_dataplus)._M_p,phase->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," phase:",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    plVar4 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    return;
  }
  peVar2 = (reader->super___shared_ptr<const_Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  line.field_2._8_8_ = phase;
  (*peVar2->_vptr_Readable[4])(&local_80,peVar2,(peVar1->sourceIndex - peVar1->sourceColumn) + 1);
  local_50 = &arrow._M_string_length;
  arrow._M_dataplus._M_p = (pointer)0x0;
  arrow._M_string_length._0_1_ = 0;
  if (1 < ((token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->sourceColumn) {
    uVar5 = 1;
    do {
      std::__cxx11::string::append((char *)&local_50);
      uVar5 = uVar5 + 1;
    } while (uVar5 < ((token->super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                     sourceColumn);
  }
  std::__cxx11::string::append((char *)&local_50);
  std::__ostream_insert<char,std::char_traits<char>>(out,"On line ",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," at column ",0xb);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," within source index at ",0x18);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," an error was discovered during ",0x20)
  ;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,*(char **)line.field_2._8_8_,*(long *)(line.field_2._8_8_ + 8));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," phase:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_80,(long)line._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_50,(long)arrow._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (local_50 != &arrow._M_string_length) {
    operator_delete(local_50,CONCAT71(arrow._M_string_length._1_7_,
                                      (undefined1)arrow._M_string_length) + 1);
  }
  if ((size_type *)local_80 != &line._M_string_length) {
    operator_delete(local_80,line._M_string_length + 1);
  }
  return;
}

Assistant:

void Error::reportErrorAtToken(
    std::ostream & out,
    const std::string & phase,
    const std::shared_ptr<const Readable>& reader,
    const std::shared_ptr<Token>& token,
    const std::string & message) {

  if (token->tokenType == TokenType::EndOfFile) {
    out
      << "At end of file an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl << std::endl;

  } else {
    std::size_t startofLine = token->sourceIndex - (token->sourceColumn - 1);
    auto line = reader->getLineFromIndex(startofLine);

    std::string arrow;

    for (std::size_t i = 1; i < token->sourceColumn; i++) {
      arrow.append("~");
    }

    arrow.append("^");

    out
      << "On line " << token->sourceLine
      << " at column " << token->sourceColumn
      << " within source index at " << token->sourceIndex
      << " an error was discovered during " << phase << " phase:" << std::endl
      << message << std::endl
      << line << std::endl
      << arrow << std::endl << std::endl;
  }
}